

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O1

void __thiscall
HdlcAnalyzer::ProcessFcsField(HdlcAnalyzer *this,vector<HdlcByte,_std::allocator<HdlcByte>_> *fcs)

{
  HdlcFcsType HVar1;
  pointer puVar2;
  pointer puVar3;
  HdlcAnalyzer *pHVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  pointer puVar9;
  size_t __len;
  size_t __n;
  bool bVar10;
  Frame frame;
  vector<unsigned_char,_std::allocator<unsigned_char>_> readFcs;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  ulong local_70;
  undefined2 local_68;
  HdlcAnalyzer *local_58;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  pointer local_38;
  
  HdlcBytesToVectorBytes(&local_50,(HdlcAnalyzer *)fcs,fcs);
  HVar1 = ((this->mSettings)._M_ptr)->mHdlcFcs;
  if (HVar1 == HDLC_CRC8) {
    puVar9 = (this->mCurrentFrameBytes).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != puVar9) {
      (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish = puVar9 + -1;
    }
    HdlcSimulationDataGenerator::Crc8(&local_88,&this->mCurrentFrameBytes);
    puVar9 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else if (HVar1 == HDLC_CRC16) {
    if (1 < (ulong)((long)(this->mCurrentFrameBytes).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->mCurrentFrameBytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (this->mCurrentFrameBytes).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + -2;
    }
    HdlcSimulationDataGenerator::Crc16(&local_88,&this->mCurrentFrameBytes);
    puVar9 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else if (HVar1 == HDLC_CRC32) {
    if (3 < (ulong)((long)(this->mCurrentFrameBytes).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->mCurrentFrameBytes).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start)) {
      (this->mCurrentFrameBytes).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           (this->mCurrentFrameBytes).
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish + -4;
    }
    HdlcSimulationDataGenerator::Crc32(&local_88,&this->mCurrentFrameBytes);
    puVar9 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    puVar9 = (pointer)0x0;
  }
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    puVar8 = (pointer)0x0;
  }
  else {
    iVar5 = (int)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish * 8 +
            (int)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start * -8;
    uVar6 = 0;
    puVar8 = (pointer)0x0;
    do {
      iVar5 = iVar5 + -8;
      puVar8 = (pointer)((ulong)puVar8 |
                        (long)(int)((uint)local_50.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_start[uVar6] <<
                                   ((byte)iVar5 & 0x1f)));
      uVar6 = uVar6 + 1;
    } while ((uVar6 & 0xffffffff) <
             (ulong)((long)local_50.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start));
  }
  __n = (long)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar9;
  if (__n == 0) {
    uVar6 = 0;
  }
  else {
    iVar5 = (int)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish * 8 + (int)puVar9 * -8;
    uVar7 = 0;
    uVar6 = 0;
    do {
      iVar5 = iVar5 + -8;
      uVar6 = uVar6 | (long)(int)((uint)puVar9[uVar7] << ((byte)iVar5 & 0x1f));
      uVar7 = uVar7 + 1;
    } while ((uVar7 & 0xffffffff) < __n);
  }
  puVar2 = (pointer)((fcs->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
                     super__Vector_impl_data._M_start)->startSample;
  puVar3 = (pointer)(fcs->super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>)._M_impl.
                    super__Vector_impl_data._M_finish[-1].endSample;
  local_58 = this;
  local_38 = local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  Frame::Frame((Frame *)&local_88);
  pHVar4 = local_58;
  bVar10 = __n != (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
  local_68 = 6;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar2;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3;
  local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar8;
  local_70 = uVar6;
  if ((local_38 != puVar9) &&
     (__n == (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start)) {
    iVar5 = bcmp(puVar9,local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,__n);
    bVar10 = iVar5 != 0;
  }
  if (bVar10) {
    local_68 = CONCAT11(0x80,(undefined1)local_68);
  }
  std::vector<Frame,_std::allocator<Frame>_>::push_back
            (&pHVar4->mResultFrames,(value_type *)&local_88);
  AnalyzerResults::AddMarker
            ((ulonglong)(pHVar4->mResults)._M_ptr,
             (MarkerType)
             local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish,(Channel *)0x9);
  Frame::~Frame((Frame *)&local_88);
  if (local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (puVar9 != (pointer)0x0) {
    operator_delete(puVar9);
  }
  return;
}

Assistant:

void HdlcAnalyzer::ProcessFcsField( const vector<HdlcByte>& fcs )
{
    vector<U8> calculatedFcs;
    vector<U8> readFcs = HdlcBytesToVectorBytes( fcs );

    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
    {
        if( !mCurrentFrameBytes.empty() )
        {
            mCurrentFrameBytes.pop_back();
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc8( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC16:
    {
        if( mCurrentFrameBytes.size() >= 2 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 2, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc16( mCurrentFrameBytes );
        break;
    }
    case HDLC_CRC32:
    {
        if( mCurrentFrameBytes.size() >= 4 )
        {
            mCurrentFrameBytes.erase( mCurrentFrameBytes.end() - 4, mCurrentFrameBytes.end() );
        }
        calculatedFcs = HdlcSimulationDataGenerator::Crc32( mCurrentFrameBytes );
        break;
    }
    }

    Frame frame = CreateFrame( HDLC_FIELD_FCS, fcs.front().startSample, fcs.back().endSample, VectorToValue( readFcs ),
                               VectorToValue( calculatedFcs ) );

    if( calculatedFcs != readFcs )
    {
        frame.mFlags = DISPLAY_AS_ERROR_FLAG;
    }

    AddFrameToResults( frame );

    // Put a marker in the end of the HDLC frame
    mResults->AddMarker( frame.mEndingSampleInclusive, AnalyzerResults::Stop, mSettings->mInputChannel );
}